

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_heterogeneous_queue_basic_tests.cpp
# Opt level: O2

void density_tests::conc_heterogeneous_queue_lifetime_tests(void)

{
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  bool bVar3;
  runtime_type<> *prVar4;
  int *piVar5;
  int local_fc;
  __native_type local_f8;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_d0;
  consume_operation cons;
  __native_type local_98;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_70;
  conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator> move_only_queue
  ;
  
  local_98._16_8_ = 0;
  local_98.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_98.__align = 0;
  local_98._8_8_ = 0;
  local_98.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_70.m_head = (ControlBlock *)0xffef;
  local_70.m_tail = (ControlBlock *)0xffef;
  local_f8.__data.__lock = 1;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                    *)&local_98.__data,(int *)local_f8.__size);
  local_f8.__data.__lock = 2;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                    *)&local_98.__data,(int *)local_f8.__size);
  local_f8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_f8._16_8_ = 0;
  local_f8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_f8.__align = 0;
  local_f8._8_8_ = 0;
  local_d0.m_head = local_70.m_head;
  local_d0.m_tail = local_70.m_tail;
  local_70.m_head = (ControlBlock *)0xffef;
  local_70.m_tail = (ControlBlock *)0xffef;
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_98.__data);
  if (bVar3) {
    bVar3 = density::
            conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_f8.__data);
    if (bVar3) goto LAB_011d1864;
  }
  else {
LAB_011d1864:
    detail::assert_failed<>
              ("queue.empty() && !other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x20);
  }
  pCVar2 = local_70.m_tail;
  pCVar1 = local_70.m_head;
  local_70.m_head = local_d0.m_head;
  local_70.m_tail = local_d0.m_tail;
  local_d0.m_head = pCVar1;
  local_d0.m_tail = pCVar2;
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_98.__data);
  if (bVar3) {
LAB_011d18a8:
    detail::assert_failed<>
              ("!queue.empty() && other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x24);
  }
  else {
    bVar3 = density::
            conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_f8.__data);
    if (!bVar3) goto LAB_011d18a8;
  }
  pCVar2 = local_70.m_tail;
  pCVar1 = local_70.m_head;
  local_70.m_head = local_d0.m_head;
  local_70.m_tail = local_d0.m_tail;
  local_d0.m_head = pCVar1;
  local_d0.m_tail = pCVar2;
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_98.__data);
  if (bVar3) {
    bVar3 = density::
            conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_f8.__data);
    if (bVar3) goto LAB_011d18ec;
  }
  else {
LAB_011d18ec:
    detail::assert_failed<>
              ("queue.empty() && !other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x26);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume(&cons,(conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)&local_f8.__data);
  if (cons.m_consume_operation.m_control == (ControlBlock *)0x0) {
LAB_011d1941:
    detail::assert_failed<>
              ("cons && cons.complete_type().is<int>() && cons.element<int>() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x28);
  }
  else {
    prVar4 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type(&cons.m_consume_operation);
    if (prVar4->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) goto LAB_011d1941;
    piVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::element<int>(&cons.m_consume_operation);
    if (*piVar5 != 1) goto LAB_011d1941;
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit(&cons);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((consume_operation *)&move_only_queue,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_f8.__data);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=(&cons,(consume_operation *)&move_only_queue);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&move_only_queue);
  if (cons.m_consume_operation.m_control != (ControlBlock *)0x0) {
    prVar4 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type(&cons.m_consume_operation);
    if (prVar4->m_feature_table ==
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) {
      piVar5 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>(&cons.m_consume_operation);
      if (*piVar5 == 2) goto LAB_011d19cf;
    }
  }
  detail::assert_failed<>
            ("cons && cons.complete_type().is<int>() && cons.element<int>() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
             ,0x2b);
LAB_011d19cf:
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit(&cons);
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_f8.__data);
  if (!bVar3) {
    detail::assert_failed<>
              ("other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x2d);
  }
  move_only_queue.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  move_only_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  move_only_queue.m_mutex.super___mutex_base._M_mutex.__align = 0;
  move_only_queue.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  move_only_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  move_only_queue.m_queue.m_head = (ControlBlock *)0xffef;
  move_only_queue.m_queue.m_tail = (ControlBlock *)0xffef;
  local_fc = 1;
  density::conc_heter_queue<density::runtime_type<>,density_tests::move_only_void_allocator>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density_tests::move_only_void_allocator>
                    *)&move_only_queue,&local_fc);
  local_fc = 2;
  density::conc_heter_queue<density::runtime_type<>,density_tests::move_only_void_allocator>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density_tests::move_only_void_allocator>
                    *)&move_only_queue,&local_fc);
  density::heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::destroy
            (&move_only_queue.m_queue);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation(&cons);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_d0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_70);
  return;
}

Assistant:

void conc_heterogeneous_queue_basic_void_tests()
    {
        {
            QUEUE queue;
            DENSITY_TEST_ASSERT(queue.empty());
        }

        {
            QUEUE queue;
            queue.clear();

            queue.push(1);
            DENSITY_TEST_ASSERT(!queue.empty());

            queue.clear();
            DENSITY_TEST_ASSERT(queue.empty());
            queue.clear();
        }
    }